

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_serial.c
# Opt level: O0

sunrealtype N_VDotProd_Serial(N_Vector x,N_Vector y)

{
  sunrealtype *yd;
  sunrealtype *xd;
  sunrealtype sum;
  sunindextype N;
  sunindextype i;
  N_Vector y_local;
  N_Vector x_local;
  
  sum = 0.0;
  for (i = 0; i < *x->content; i = i + 1) {
    sum = *(double *)(*(long *)((long)x->content + 0x10) + i * 8) *
          *(double *)(*(long *)((long)y->content + 0x10) + i * 8) + sum;
  }
  return sum;
}

Assistant:

sunrealtype N_VDotProd_Serial(N_Vector x, N_Vector y)
{
  sunindextype i, N;
  sunrealtype sum, *xd, *yd;

  sum = ZERO;
  xd = yd = NULL;

  N  = NV_LENGTH_S(x);
  xd = NV_DATA_S(x);
  yd = NV_DATA_S(y);

  for (i = 0; i < N; i++) { sum += xd[i] * yd[i]; }

  return (sum);
}